

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtrm(fitsfile *gfptr,int rmopt,int *status)

{
  int iVar1;
  int *in_RDX;
  int in_ESI;
  bool bVar2;
  HDUtracker HDU;
  long nmembers;
  long i;
  int hdutype;
  undefined8 auStack_5df8 [4];
  int *in_stack_ffffffffffffa228;
  int *in_stack_ffffffffffffa230;
  fitsfile *in_stack_ffffffffffffa238;
  int *in_stack_ffffffffffffa288;
  long *in_stack_ffffffffffffa290;
  fitsfile *in_stack_ffffffffffffa298;
  int *in_stack_ffffffffffffa2a8;
  HDUtracker *in_stack_ffffffffffffa2b0;
  fitsfile *in_stack_ffffffffffffa2b8;
  char *in_stack_ffffffffffffaa28;
  int *in_stack_ffffffffffffaa30;
  HDUtracker *in_stack_ffffffffffffaa38;
  fitsfile *in_stack_ffffffffffffaa40;
  int *in_stack_ffffffffffffaba8;
  int in_stack_ffffffffffffabb4;
  fitsfile *in_stack_ffffffffffffabb8;
  int *in_stack_ffffffffffffbfd0;
  int in_stack_ffffffffffffbfdc;
  long in_stack_ffffffffffffbfe0;
  fitsfile *in_stack_ffffffffffffbfe8;
  undefined8 auStack_2f18 [1500];
  long local_38;
  long local_30;
  int *local_20;
  int local_4;
  
  local_38 = 0;
  if (*in_RDX == 0) {
    local_20 = in_RDX;
    if (in_ESI == 0) {
      iVar1 = ffgtnm(in_stack_ffffffffffffa298,in_stack_ffffffffffffa290,in_stack_ffffffffffffa288);
      *local_20 = iVar1;
      local_30 = local_38;
      while( true ) {
        bVar2 = false;
        if (0 < local_30) {
          bVar2 = *local_20 == 0;
        }
        if (!bVar2) break;
        iVar1 = ffgmrm(in_stack_ffffffffffffbfe8,in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfdc
                       ,in_stack_ffffffffffffbfd0);
        *local_20 = iVar1;
        local_30 = local_30 + -1;
      }
    }
    else if (in_ESI == 3) {
      iVar1 = fftsad(in_stack_ffffffffffffaa40,in_stack_ffffffffffffaa38,in_stack_ffffffffffffaa30,
                     in_stack_ffffffffffffaa28);
      *local_20 = iVar1;
      iVar1 = ffgtrmr(in_stack_ffffffffffffa2b8,in_stack_ffffffffffffa2b0,in_stack_ffffffffffffa2a8)
      ;
      *local_20 = iVar1;
      for (local_30 = 0; local_30 < 0; local_30 = local_30 + 1) {
        free((void *)auStack_5df8[local_30]);
        free((void *)auStack_2f18[local_30]);
      }
    }
    else {
      *in_RDX = 0x15b;
      ffpmsg((char *)0x1d6d19);
    }
    iVar1 = ffgmul(in_stack_ffffffffffffabb8,in_stack_ffffffffffffabb4,in_stack_ffffffffffffaba8);
    *local_20 = iVar1;
    iVar1 = ffdhdu(in_stack_ffffffffffffa238,in_stack_ffffffffffffa230,in_stack_ffffffffffffa228);
    *local_20 = iVar1;
    local_4 = *local_20;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgtrm(fitsfile *gfptr,  /* FITS file pointer to group                   */
	   int       rmopt,  /* code specifying if member
				elements are to be deleted:
				OPT_RM_GPT ==> remove only group table
				OPT_RM_ALL ==> recursively remove members
				and their members (if groups)                */
	   int      *status) /* return status code                           */
	    
/*
  remove a grouping table, and optionally all its members. Any groups 
  containing the grouping table are updated, and all members (if not 
  deleted) have their GRPIDn and GRPLCn keywords updated accordingly. 
  If the (deleted) members are members of another grouping table then those
  tables are also updated. The CHDU of the FITS file pointed to by gfptr must 
  be positioned to the grouping table to be deleted.
*/

{
  int hdutype;

  long i;
  long nmembers = 0;

  HDUtracker HDU;
  

  if(*status != 0) return(*status);

  /*
     remove the grouping table depending upon the rmopt parameter
  */

  switch(rmopt)
    {

    case OPT_RM_GPT:

      /*
	 for this option, the grouping table is deleted, but the member
	 HDUs remain; in this case we only have to remove each member from
	 the grouping table by calling fits_remove_member() with the
	 OPT_RM_ENTRY option
      */

      /* get the number of members contained by this table */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      /* loop over all grouping table members and remove them */

      for(i = nmembers; i > 0 && *status == 0; --i)
	*status = fits_remove_member(gfptr,i,OPT_RM_ENTRY,status);
      
	break;

    case OPT_RM_ALL:

      /*
	for this option the entire Group is deleted -- this includes all
	members and their members (if grouping tables themselves). Call 
	the recursive form of this function to perform the removal.
      */

      /* add the current grouping table to the HDUtracker struct */

      HDU.nHDU = 0;

      *status = fftsad(gfptr,&HDU,NULL,NULL);

      /* call the recursive group remove function */

      *status = ffgtrmr(gfptr,&HDU,status);

      /* free the memory allocated to the HDUtracker struct */

      for(i = 0; i < HDU.nHDU; ++i)
	{
	  free(HDU.filename[i]);
	  free(HDU.newFilename[i]);
	}

      break;

    default:
      
      *status = BAD_OPTION;
      ffpmsg("Invalid value for the rmopt parameter specified (ffgtrm)");
      break;

     }

  /*
     if all went well then unlink and delete the grouping table HDU
  */

  *status = ffgmul(gfptr,0,status);

  *status = fits_delete_hdu(gfptr,&hdutype,status);
      
  return(*status);
}